

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomGen.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
RandomGen::VonNeumann
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,RandomGen *this,
          double xMin,double xMax,double yMin,double yMax,double xTest,double yTest,double fValue)

{
  RandomGen *pRVar1;
  pointer pdVar2;
  double dVar3;
  allocator_type local_49;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  
  local_48 = yMin;
  local_40 = yMax;
  local_38 = xMin;
  local_30 = xMax;
  local_28 = xTest;
  local_20 = yTest;
  local_18 = fValue;
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,3,&local_49);
  pdVar2 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  *pdVar2 = local_28;
  pdVar2[1] = local_20;
  dVar3 = 0.0;
  if (local_18 < local_20) {
    pRVar1 = rndm();
    dVar3 = rand_uniform(pRVar1);
    *(__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
     super__Vector_impl_data._M_start = (local_30 - local_38) * dVar3 + local_38;
    pRVar1 = rndm();
    dVar3 = rand_uniform(pRVar1);
    pdVar2 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2[1] = (local_40 - local_48) * dVar3 + local_48;
    dVar3 = 1.0;
  }
  pdVar2[2] = dVar3;
  return __return_storage_ptr__;
}

Assistant:

vector<double> RandomGen::VonNeumann(double xMin, double xMax, double yMin,
                                     double yMax, double xTest, double yTest,
                                     double fValue) {
  vector<double> xyTry(3);

  xyTry[0] = xTest;
  xyTry[1] = yTest;

  if (xyTry[1] > fValue) {
    xyTry[0] = xMin + (xMax - xMin) * RandomGen::rndm()->rand_uniform();
    xyTry[1] = yMin + (yMax - yMin) * RandomGen::rndm()->rand_uniform();
    xyTry[2] = 1.;
  } else
    xyTry[2] = 0.;

  return xyTry;  // doing a vector means you can return 2 values at the same
                 // time
}